

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u32 offset,u32 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  u32 addend_00;
  u32 offset_00;
  bool bVar1;
  Result RVar2;
  unsigned_long val;
  unsigned_long local_40;
  unsigned_long lhs;
  unsigned_long *out_local;
  BinopFunc<unsigned_long,_unsigned_long> **func_local;
  unsigned_long rhs_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  lhs = (unsigned_long)out;
  out_local = (unsigned_long *)func;
  func_local = (BinopFunc<unsigned_long,_unsigned_long> **)rhs;
  rhs_local._0_4_ = addend;
  rhs_local._4_4_ = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_long>(this,offset,addend,&local_40);
  bVar1 = Failed(RVar2);
  offset_00 = rhs_local._4_4_;
  addend_00 = (u32)rhs_local;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (*(code *)*out_local)(local_40,func_local);
    RVar2 = AtomicStore<unsigned_long>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(unsigned_long *)lhs = local_40;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u32 offset, u32 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}